

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

IceTBoolean icetStrategySupportsOrdering(IceTEnum strategy)

{
  IceTBoolean local_9;
  IceTEnum strategy_local;
  
  if (strategy == 0xffffffff) {
    icetRaiseDiagnostic("Strategy not defined. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x60);
    local_9 = '\0';
  }
  else if (strategy == 0x6001) {
    local_9 = '\x01';
  }
  else if (strategy == 0x6002) {
    local_9 = '\x01';
  }
  else if (strategy == 0x6003) {
    local_9 = '\0';
  }
  else if (strategy == 0x6004) {
    local_9 = '\x01';
  }
  else if (strategy == 0x6005) {
    local_9 = '\0';
  }
  else {
    icetRaiseDiagnostic("Invalid strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,99);
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

IceTBoolean icetStrategySupportsOrdering(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return ICET_TRUE;
      case ICET_STRATEGY_SEQUENTIAL:    return ICET_TRUE;
      case ICET_STRATEGY_SPLIT:         return ICET_FALSE;
      case ICET_STRATEGY_REDUCE:        return ICET_TRUE;
      case ICET_STRATEGY_VTREE:         return ICET_FALSE;
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return ICET_FALSE;
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return ICET_FALSE;
    }
}